

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::GetTapScriptTreeFromString
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptFromStringRequestStruct_&)>
  local_58;
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptFromStringRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::TapScriptFromStringRequestStruct_const&)>
  ::
  function<cfd::js::api::TapScriptInfoStruct(&)(cfd::js::api::TapScriptFromStringRequestStruct_const&),void>
            ((function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::TapScriptFromStringRequestStruct_const&)>
              *)&local_38,AddressStructApi::GetTapScriptTreeFromString);
  std::
  function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::TapScriptFromStringRequestStruct_const&)>
  ::
  function<cfd::js::api::TapScriptInfoStruct(&)(cfd::js::api::TapScriptFromStringRequestStruct_const&),void>
            ((function<cfd::js::api::TapScriptInfoStruct(cfd::js::api::TapScriptFromStringRequestStruct_const&)>
              *)&local_58,ElementsAddressStructApi::GetTapScriptTreeFromString);
  ExecuteElementsCheckApi<cfd::js::api::json::TapScriptFromStringRequest,cfd::js::api::json::TapScriptInfo,cfd::js::api::TapScriptFromStringRequestStruct,cfd::js::api::TapScriptInfoStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptFromStringRequestStruct_&)>
  ::~function(&local_58);
  std::
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptFromStringRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::GetTapScriptTreeFromString(
    const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::TapScriptFromStringRequest, api::json::TapScriptInfo,
      api::TapScriptFromStringRequestStruct, api::TapScriptInfoStruct>(
      request_message, AddressStructApi::GetTapScriptTreeFromString,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressStructApi::GetTapScriptTreeFromString);
#else
      AddressStructApi::GetTapScriptTreeFromString);
#endif
}